

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

bool spdlog::details::os::create_dir(filename_t *path)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  filename_t local_50;
  
  bVar1 = path_exists(path);
  bVar2 = true;
  if (!bVar1) {
    if (path->_M_string_length == 0) {
      bVar2 = false;
    }
    else {
      uVar5 = 0;
      do {
        sVar4 = std::__cxx11::string::find_first_of((char *)path,0x182834);
        if (sVar4 == 0xffffffffffffffff) {
          sVar4 = path->_M_string_length;
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
        if (((local_50._M_string_length == 0) || (bVar2 = path_exists(&local_50), bVar2)) ||
           (iVar3 = mkdir(local_50._M_dataplus._M_p,0x1ed), iVar3 == 0)) {
          uVar5 = sVar4 + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&local_50);
      } while ((bVar2) && (uVar5 < path->_M_string_length));
    }
  }
  return bVar2;
}

Assistant:

SPDLOG_INLINE bool create_dir(const filename_t &path)
{
    if (path_exists(path))
    {
        return true;
    }

    if (path.empty())
    {
        return false;
    }

    size_t search_offset = 0;
    do
    {
        auto token_pos = path.find_first_of(folder_seps_filename, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos)
        {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir))
        {
            return false; // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}